

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onehot.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  reference pvVar5;
  long in_RSI;
  int in_EDI;
  ostringstream error_message_6;
  ostringstream error_message_5;
  int sample_index;
  vector<double,_std::allocator<double>_> onehot_vector;
  int index;
  istream *input_stream;
  ostringstream error_message_4;
  ifstream ifs;
  ostringstream error_message_3;
  char *input_file;
  ostringstream error_message_2;
  int num_input_files;
  ostringstream error_message_1;
  ostringstream error_message;
  int option_char;
  int vector_length;
  option *in_stack_fffffffffffff0e8;
  allocator *paVar6;
  istream *in_stack_fffffffffffff0f0;
  undefined7 in_stack_fffffffffffff0f8;
  undefined1 in_stack_fffffffffffff0ff;
  allocator *in_stack_fffffffffffff100;
  size_type in_stack_fffffffffffff108;
  undefined7 in_stack_fffffffffffff110;
  undefined1 in_stack_fffffffffffff117;
  int *actual_write_size;
  ostream *poVar7;
  undefined7 in_stack_fffffffffffff130;
  undefined8 in_stack_fffffffffffff138;
  undefined8 in_stack_fffffffffffff140;
  char *local_e90;
  bool local_e5a;
  allocator local_e19;
  string local_e18 [32];
  ostringstream local_df8 [208];
  ostringstream *in_stack_fffffffffffff2d8;
  string *in_stack_fffffffffffff2e0;
  allocator local_c79;
  string local_c78 [32];
  ostringstream local_c58 [376];
  int local_ae0;
  undefined1 local_ad9 [9];
  vector<double,_std::allocator<double>_> local_ad0;
  int local_ab4;
  ostream *local_ab0;
  undefined4 local_aa8;
  allocator local_aa1;
  string local_aa0 [32];
  ostringstream local_a80 [376];
  ostream local_908 [527];
  allocator local_6f9;
  string local_6f8 [32];
  ostringstream local_6d8 [376];
  char *local_560;
  allocator local_551;
  string local_550 [32];
  ostringstream local_530 [376];
  int local_3b8;
  allocator local_3b1;
  string local_3b0 [32];
  ostringstream local_390 [383];
  allocator local_211;
  string local_210 [39];
  allocator local_1e9;
  string local_1e8 [32];
  ostringstream local_1c8 [399];
  allocator local_39;
  string local_38 [32];
  int local_18;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = 10;
  local_10 = in_RSI;
  local_8 = in_EDI;
  while (local_18 = ya_getopt_long((int)((ulong)in_stack_fffffffffffff100 >> 0x20),
                                   (char **)CONCAT17(in_stack_fffffffffffff0ff,
                                                     in_stack_fffffffffffff0f8),
                                   (char *)in_stack_fffffffffffff0f0,in_stack_fffffffffffff0e8,
                                   (int *)0x1036bf), pcVar1 = ya_optarg, local_18 != -1) {
    if (local_18 == 0x68) {
      anon_unknown.dwarf_172b::PrintUsage((ostream *)in_stack_fffffffffffff100);
      return 0;
    }
    if (local_18 == 0x6c) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_38,pcVar1,&local_39);
      bVar2 = sptk::ConvertStringToInteger
                        ((string *)CONCAT17(in_stack_fffffffffffff0ff,in_stack_fffffffffffff0f8),
                         (int *)in_stack_fffffffffffff0f0);
      bVar3 = local_14 < 1;
      std::__cxx11::string::~string(local_38);
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
      if (!bVar2 || bVar3) {
        std::__cxx11::ostringstream::ostringstream(local_1c8);
        std::operator<<((ostream *)local_1c8,
                        "The argument for the -l option must be a positive integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_1e8,"onehot",&local_1e9);
        sptk::PrintErrorMessage(in_stack_fffffffffffff2e0,in_stack_fffffffffffff2d8);
        std::__cxx11::string::~string(local_1e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_1c8);
        return local_4;
      }
    }
    else {
      if (local_18 != 0x6d) {
        anon_unknown.dwarf_172b::PrintUsage((ostream *)in_stack_fffffffffffff100);
        return 1;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_210,pcVar1,&local_211);
      bVar3 = sptk::ConvertStringToInteger
                        ((string *)CONCAT17(in_stack_fffffffffffff0ff,in_stack_fffffffffffff0f8),
                         (int *)in_stack_fffffffffffff0f0);
      local_e5a = !bVar3 || local_14 < 0;
      std::__cxx11::string::~string(local_210);
      std::allocator<char>::~allocator((allocator<char> *)&local_211);
      if (local_e5a) {
        std::__cxx11::ostringstream::ostringstream(local_390);
        poVar7 = std::operator<<((ostream *)local_390,"The argument for the -m option must be a ");
        std::operator<<(poVar7,"non-negative integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3b0,"onehot",&local_3b1);
        sptk::PrintErrorMessage(in_stack_fffffffffffff2e0,in_stack_fffffffffffff2d8);
        std::__cxx11::string::~string(local_3b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_3b1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_390);
        return local_4;
      }
      local_14 = local_14 + 1;
    }
  }
  local_3b8 = local_8 - ya_optind;
  if (1 < local_3b8) {
    std::__cxx11::ostringstream::ostringstream(local_530);
    std::operator<<((ostream *)local_530,"Too many input files");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_550,"onehot",&local_551);
    sptk::PrintErrorMessage(in_stack_fffffffffffff2e0,in_stack_fffffffffffff2d8);
    std::__cxx11::string::~string(local_550);
    std::allocator<char>::~allocator((allocator<char> *)&local_551);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_530);
    return local_4;
  }
  if (local_3b8 == 0) {
    local_e90 = (char *)0x0;
  }
  else {
    local_e90 = *(char **)(local_10 + (long)ya_optind * 8);
  }
  local_560 = local_e90;
  bVar3 = sptk::SetBinaryMode();
  if (!bVar3) {
    std::__cxx11::ostringstream::ostringstream(local_6d8);
    std::operator<<((ostream *)local_6d8,"Cannot set translation mode");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_6f8,"onehot",&local_6f9);
    sptk::PrintErrorMessage(in_stack_fffffffffffff2e0,in_stack_fffffffffffff2d8);
    std::__cxx11::string::~string(local_6f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_6f9);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_6d8);
    return local_4;
  }
  std::ifstream::ifstream(local_908);
  pcVar1 = local_560;
  if (local_560 != (char *)0x0) {
    std::operator|(_S_in,_S_bin);
    std::ifstream::open((char *)local_908,(_Ios_Openmode)pcVar1);
    bVar4 = std::ios::fail();
    if ((bVar4 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_a80);
      poVar7 = std::operator<<((ostream *)local_a80,"Cannot open file ");
      std::operator<<(poVar7,local_560);
      paVar6 = &local_aa1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_aa0,"onehot",paVar6);
      sptk::PrintErrorMessage(in_stack_fffffffffffff2e0,in_stack_fffffffffffff2d8);
      std::__cxx11::string::~string(local_aa0);
      std::allocator<char>::~allocator((allocator<char> *)&local_aa1);
      local_4 = 1;
      local_aa8 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_a80);
      goto LAB_00104476;
    }
  }
  bVar4 = std::ifstream::is_open();
  if ((bVar4 & 1) == 0) {
    poVar7 = (ostream *)&std::cin;
  }
  else {
    poVar7 = local_908;
  }
  local_ad9._1_8_ = 0;
  actual_write_size = (int *)local_ad9;
  local_ab0 = poVar7;
  std::allocator<double>::allocator((allocator<double> *)0x1040b9);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT17(in_stack_fffffffffffff117,in_stack_fffffffffffff110),in_stack_fffffffffffff108
             ,(value_type *)in_stack_fffffffffffff100,
             (allocator_type *)CONCAT17(in_stack_fffffffffffff0ff,in_stack_fffffffffffff0f8));
  std::allocator<double>::~allocator((allocator<double> *)0x1040e7);
  local_ae0 = 0;
  while (bVar3 = sptk::ReadStream<int>
                           ((int *)CONCAT17(in_stack_fffffffffffff0ff,in_stack_fffffffffffff0f8),
                            in_stack_fffffffffffff0f0), bVar3) {
    if ((local_ab4 < 0) || (local_14 <= local_ab4)) {
      std::__cxx11::ostringstream::ostringstream(local_c58);
      poVar7 = (ostream *)std::ostream::operator<<(local_c58,local_ae0);
      std::operator<<(poVar7,"th sample is out of range");
      in_stack_fffffffffffff100 = &local_c79;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_c78,"onehot",in_stack_fffffffffffff100);
      sptk::PrintErrorMessage(in_stack_fffffffffffff2e0,in_stack_fffffffffffff2d8);
      std::__cxx11::string::~string(local_c78);
      std::allocator<char>::~allocator((allocator<char> *)&local_c79);
      local_4 = 1;
      local_aa8 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_c58);
      goto LAB_00104458;
    }
    in_stack_fffffffffffff0f0 = (istream *)&local_ad0;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff0f0,
                        (long)local_ab4);
    *pvVar5 = 1.0;
    in_stack_fffffffffffff0ff =
         sptk::WriteStream<double>
                   ((int)in_stack_fffffffffffff140,(int)((ulong)in_stack_fffffffffffff138 >> 0x20),
                    (vector<double,_std::allocator<double>_> *)
                    CONCAT17(bVar4,in_stack_fffffffffffff130),poVar7,actual_write_size);
    if (!(bool)in_stack_fffffffffffff0ff) {
      std::__cxx11::ostringstream::ostringstream(local_df8);
      std::operator<<((ostream *)local_df8,"Failed to write one-hot vector");
      paVar6 = &local_e19;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e18,"onehot",paVar6);
      sptk::PrintErrorMessage(in_stack_fffffffffffff2e0,in_stack_fffffffffffff2d8);
      std::__cxx11::string::~string(local_e18);
      std::allocator<char>::~allocator((allocator<char> *)&local_e19);
      local_4 = 1;
      local_aa8 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_df8);
      goto LAB_00104458;
    }
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_ad0,(long)local_ab4);
    *pvVar5 = 0.0;
    local_ae0 = local_ae0 + 1;
  }
  local_4 = 0;
  local_aa8 = 1;
LAB_00104458:
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff100);
LAB_00104476:
  std::ifstream::~ifstream(local_908);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  int vector_length(kDefaultVectorLength);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:m:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("onehot", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("onehot", error_message);
          return 1;
        }
        ++vector_length;
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("onehot", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("onehot", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("onehot", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  int index;
  std::vector<double> onehot_vector(vector_length, 0.0);

  for (int sample_index(0); sptk::ReadStream(&index, &input_stream);
       ++sample_index) {
    if (index < 0 || vector_length <= index) {
      std::ostringstream error_message;
      error_message << sample_index << "th sample is out of range";
      sptk::PrintErrorMessage("onehot", error_message);
      return 1;
    }
    onehot_vector[index] = 1.0;
    if (!sptk::WriteStream(0, vector_length, onehot_vector, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write one-hot vector";
      sptk::PrintErrorMessage("onehot", error_message);
      return 1;
    }
    // cppcheck-suppress unreadVariable
    onehot_vector[index] = 0.0;
  }

  return 0;
}